

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStandardLevelResolver.cxx
# Opt level: O1

bool __thiscall
cmStandardLevelResolver::CompileFeatureKnown
          (cmStandardLevelResolver *this,string *targetName,string *feature,string *lang,
          string *error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMakefile *this_00;
  string *this_01;
  size_type sVar3;
  char **ppcVar4;
  ostream *poVar5;
  char *pcVar6;
  char *pcVar7;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  size_type local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2c0;
  size_type local_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  size_type local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  string local_260;
  cmStandardLevelResolver *local_240;
  string *local_238;
  string *local_230;
  cmStrCmp local_228;
  cmStrCmp local_208;
  cmStrCmp local_1e8;
  cmStrCmp local_1c8;
  undefined1 local_1a8 [376];
  
  local_240 = this;
  local_230 = targetName;
  sVar3 = cmGeneratorExpression::Find(feature);
  if (sVar3 != 0xffffffffffffffff) {
    __assert_fail("cmGeneratorExpression::Find(feature) == std::string::npos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmStandardLevelResolver.cxx"
                  ,0x1f0,
                  "bool cmStandardLevelResolver::CompileFeatureKnown(const std::string &, const std::string &, std::string &, std::string *) const"
                 );
  }
  pcVar2 = (feature->_M_dataplus)._M_p;
  local_280 = &local_270;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,pcVar2,pcVar2 + feature->_M_string_length);
  paVar1 = &local_1c8.Test_.field_2;
  if (local_280 == &local_270) {
    local_1c8.Test_.field_2._8_8_ = local_270._8_8_;
    local_1c8.Test_._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_1c8.Test_._M_dataplus._M_p = (pointer)local_280;
  }
  local_1c8.Test_.field_2._M_allocated_capacity._1_7_ = local_270._M_allocated_capacity._1_7_;
  local_1c8.Test_.field_2._M_local_buf[0] = local_270._M_local_buf[0];
  local_1c8.Test_._M_string_length = local_278;
  local_278 = 0;
  local_270._M_local_buf[0] = '\0';
  local_280 = &local_270;
  local_238 = error;
  ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                      ((char **)((anonymous_namespace)::C_FEATURES + 8),
                       (char **)(anonymous_namespace)::CXX_FEATURES,&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.Test_._M_dataplus._M_p != paVar1) {
    operator_delete(local_1c8.Test_._M_dataplus._M_p,
                    local_1c8.Test_.field_2._M_allocated_capacity + 1);
  }
  if (local_280 != &local_270) {
    operator_delete(local_280,
                    CONCAT71(local_270._M_allocated_capacity._1_7_,local_270._M_local_buf[0]) + 1);
  }
  if (ppcVar4 == (char **)(anonymous_namespace)::CXX_FEATURES) {
    pcVar2 = (feature->_M_dataplus)._M_p;
    local_2a0 = &local_290;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,pcVar2,pcVar2 + feature->_M_string_length);
    paVar1 = &local_1e8.Test_.field_2;
    if (local_2a0 == &local_290) {
      local_1e8.Test_.field_2._8_8_ = local_290._8_8_;
      local_1e8.Test_._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_1e8.Test_._M_dataplus._M_p = (pointer)local_2a0;
    }
    local_1e8.Test_.field_2._M_allocated_capacity._1_7_ = local_290._M_allocated_capacity._1_7_;
    local_1e8.Test_.field_2._M_local_buf[0] = local_290._M_local_buf[0];
    local_1e8.Test_._M_string_length = local_298;
    local_298 = 0;
    local_290._M_local_buf[0] = '\0';
    local_2a0 = &local_290;
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        ((char **)((anonymous_namespace)::CXX_FEATURES + 8),(char **)&DAT_00860cc8,
                         &local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8.Test_._M_dataplus._M_p != paVar1) {
      operator_delete(local_1e8.Test_._M_dataplus._M_p,
                      local_1e8.Test_.field_2._M_allocated_capacity + 1);
    }
    if (local_2a0 != &local_290) {
      operator_delete(local_2a0,
                      CONCAT71(local_290._M_allocated_capacity._1_7_,local_290._M_local_buf[0]) + 1)
      ;
    }
    if (ppcVar4 == (char **)&DAT_00860cc8) {
      pcVar2 = (feature->_M_dataplus)._M_p;
      local_2c0 = &local_2b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,pcVar2,pcVar2 + feature->_M_string_length);
      paVar1 = &local_208.Test_.field_2;
      if (local_2c0 == &local_2b0) {
        local_208.Test_.field_2._8_8_ = local_2b0._8_8_;
        local_208.Test_._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_208.Test_._M_dataplus._M_p = (pointer)local_2c0;
      }
      local_208.Test_.field_2._M_allocated_capacity._1_7_ = local_2b0._M_allocated_capacity._1_7_;
      local_208.Test_.field_2._M_local_buf[0] = local_2b0._M_local_buf[0];
      local_208.Test_._M_string_length = local_2b8;
      local_2b8 = 0;
      local_2b0._M_local_buf[0] = '\0';
      local_2c0 = &local_2b0;
      ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                          ((char **)((anonymous_namespace)::CUDA_FEATURES + 8),
                           (char **)(anonymous_namespace)::HIP_FEATURES,&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208.Test_._M_dataplus._M_p != paVar1) {
        operator_delete(local_208.Test_._M_dataplus._M_p,
                        local_208.Test_.field_2._M_allocated_capacity + 1);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0,
                        CONCAT71(local_2b0._M_allocated_capacity._1_7_,local_2b0._M_local_buf[0]) +
                        1);
      }
      if (ppcVar4 == (char **)(anonymous_namespace)::HIP_FEATURES) {
        pcVar2 = (feature->_M_dataplus)._M_p;
        local_2e0 = &local_2d0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2e0,pcVar2,pcVar2 + feature->_M_string_length);
        paVar1 = &local_228.Test_.field_2;
        if (local_2e0 == &local_2d0) {
          local_228.Test_.field_2._8_8_ = local_2d0._8_8_;
          local_228.Test_._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_228.Test_._M_dataplus._M_p = (pointer)local_2e0;
        }
        local_228.Test_.field_2._M_allocated_capacity._1_7_ = local_2d0._M_allocated_capacity._1_7_;
        local_228.Test_.field_2._M_local_buf[0] = local_2d0._M_local_buf[0];
        local_228.Test_._M_string_length = local_2d8;
        local_2d8 = 0;
        local_2d0._M_local_buf[0] = '\0';
        local_2e0 = &local_2d0;
        ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                            ((char **)((anonymous_namespace)::HIP_FEATURES + 8),
                             &cmTarget::
                              cmTarget(std::__cxx11::string_const&,cmStateEnums::TargetType,cmTarget::Visibility,cmMakefile*,cmTarget::PerConfig)
                              ::configProps,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228.Test_._M_dataplus._M_p != paVar1) {
          operator_delete(local_228.Test_._M_dataplus._M_p,
                          local_228.Test_.field_2._M_allocated_capacity + 1);
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,
                          CONCAT71(local_2d0._M_allocated_capacity._1_7_,local_2d0._M_local_buf[0])
                          + 1);
        }
        if (ppcVar4 ==
            &cmTarget::
             cmTarget(std::__cxx11::string_const&,cmStateEnums::TargetType,cmTarget::Visibility,cmMakefile*,cmTarget::PerConfig)
             ::configProps) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          this_01 = local_238;
          pcVar7 = "specified";
          if (local_238 == (string *)0x0) {
            pcVar7 = "Specified";
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar7,9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8," unknown feature \"",0x12);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(feature->_M_dataplus)._M_p,
                              feature->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" for target \"",0xe);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar5,(local_230->_M_dataplus)._M_p,local_230->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
          if (this_01 == (string *)0x0) {
            this_00 = local_240->Makefile;
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(this_00,FATAL_ERROR,&local_260);
          }
          else {
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)this_01,(string *)&local_260);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
          return false;
        }
        pcVar7 = (char *)lang->_M_string_length;
        pcVar6 = "HIP";
      }
      else {
        pcVar7 = (char *)lang->_M_string_length;
        pcVar6 = "CUDA";
      }
    }
    else {
      pcVar7 = (char *)lang->_M_string_length;
      pcVar6 = "CXX";
    }
  }
  else {
    pcVar7 = (char *)lang->_M_string_length;
    pcVar6 = "C";
  }
  std::__cxx11::string::_M_replace((ulong)lang,0,pcVar7,(ulong)pcVar6);
  return true;
}

Assistant:

bool cmStandardLevelResolver::CompileFeatureKnown(
  const std::string& targetName, const std::string& feature, std::string& lang,
  std::string* error) const
{
  assert(cmGeneratorExpression::Find(feature) == std::string::npos);

  bool isCFeature =
    std::find_if(cm::cbegin(C_FEATURES) + 1, cm::cend(C_FEATURES),
                 cmStrCmp(feature)) != cm::cend(C_FEATURES);
  if (isCFeature) {
    lang = "C";
    return true;
  }
  bool isCxxFeature =
    std::find_if(cm::cbegin(CXX_FEATURES) + 1, cm::cend(CXX_FEATURES),
                 cmStrCmp(feature)) != cm::cend(CXX_FEATURES);
  if (isCxxFeature) {
    lang = "CXX";
    return true;
  }
  bool isCudaFeature =
    std::find_if(cm::cbegin(CUDA_FEATURES) + 1, cm::cend(CUDA_FEATURES),
                 cmStrCmp(feature)) != cm::cend(CUDA_FEATURES);
  if (isCudaFeature) {
    lang = "CUDA";
    return true;
  }
  bool isHIPFeature =
    std::find_if(cm::cbegin(HIP_FEATURES) + 1, cm::cend(HIP_FEATURES),
                 cmStrCmp(feature)) != cm::cend(HIP_FEATURES);
  if (isHIPFeature) {
    lang = "HIP";
    return true;
  }
  std::ostringstream e;
  if (error) {
    e << "specified";
  } else {
    e << "Specified";
  }
  e << " unknown feature \"" << feature
    << "\" for "
       "target \""
    << targetName << "\".";
  if (error) {
    *error = e.str();
  } else {
    this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
  }
  return false;
}